

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

free_ptr<CLASSWEIGHTS::classweights> scoped_calloc_or_throw<CLASSWEIGHTS::classweights>(void)

{
  classweights *this;
  _Head_base<0UL,_CLASSWEIGHTS::classweights_*,_false> extraout_RDX;
  _Tuple_impl<1UL,_void_(*)(void_*)> in_RDI;
  free_ptr<CLASSWEIGHTS::classweights> fVar1;
  classweights *temp;
  size_t in_stack_00000198;
  pointer in_stack_ffffffffffffffc8;
  
  this = calloc_or_throw<CLASSWEIGHTS::classweights>(in_stack_00000198);
  memset(this,0,0x38);
  CLASSWEIGHTS::classweights::classweights((classweights *)0x3190c5);
  std::unique_ptr<CLASSWEIGHTS::classweights,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            ((unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)> *)this,
             in_stack_ffffffffffffffc8,
             (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)>::value,_void_(*&&)(void_*)>)
             0x3190e5);
  fVar1._M_t.super___uniq_ptr_impl<CLASSWEIGHTS::classweights,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_CLASSWEIGHTS::classweights_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_CLASSWEIGHTS::classweights_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  fVar1._M_t.super___uniq_ptr_impl<CLASSWEIGHTS::classweights,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_CLASSWEIGHTS::classweights_*,_void_(*)(void_*)>.
  super__Tuple_impl<1UL,_void_(*)(void_*)>.super__Head_base<1UL,_void_(*)(void_*),_false>.
  _M_head_impl = in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl;
  return (free_ptr<CLASSWEIGHTS::classweights>)
         fVar1._M_t.super___uniq_ptr_impl<CLASSWEIGHTS::classweights,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_CLASSWEIGHTS::classweights_*,_void_(*)(void_*)>;
}

Assistant:

free_ptr<T> scoped_calloc_or_throw()
{
  T* temp = calloc_or_throw<T>(1);
  new (temp) T();
  return std::unique_ptr<T, free_fn>(temp, destroy_free<T>);
}